

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslkey_p.cpp
# Opt level: O3

void __thiscall QSslKey::QSslKey(QSslKey *this,HANDLE handle,KeyType type)

{
  _Head_base<0UL,_QTlsPrivate::TlsKey_*,_false> _Var1;
  QSslKeyPrivate *this_00;
  
  this_00 = (QSslKeyPrivate *)operator_new(0x10);
  QSslKeyPrivate::QSslKeyPrivate(this_00);
  (this->d).d.ptr = this_00;
  LOCK();
  (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (this_00->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  _Var1._M_head_impl =
       *(TlsKey **)
        &(((this->d).d.ptr)->backend)._M_t.
         super___uniq_ptr_impl<QTlsPrivate::TlsKey,_std::default_delete<QTlsPrivate::TlsKey>_>._M_t.
         super__Tuple_impl<0UL,_QTlsPrivate::TlsKey_*,_std::default_delete<QTlsPrivate::TlsKey>_>;
  if ((_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)_Var1._M_head_impl !=
      (_Head_base<0UL,_QTlsPrivate::TlsKey_*,_false>)0x0) {
    (*(_Var1._M_head_impl)->_vptr_TlsKey[7])(_Var1._M_head_impl,handle,(ulong)type);
    return;
  }
  return;
}

Assistant:

QSslKey::QSslKey(Qt::HANDLE handle, QSsl::KeyType type)
    : d(new QSslKeyPrivate)
{
    if (auto *tlsKey = d->backend.get())
        tlsKey->fromHandle(handle, type);
}